

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.h
# Opt level: O1

void pzgeom::TPZGeoPyramid::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  TPZFNMatrix<5,_double> phi;
  TPZFNMatrix<15,_double> dphi;
  TPZFMatrix<double> local_200;
  double local_170 [6];
  TPZFMatrix<double> local_140;
  double adStack_b0 [16];
  
  local_200.fElem = local_170;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 5;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018aff40;
  local_200.fSize = 5;
  local_200.fGiven = local_200.fElem;
  TPZVec<int>::TPZVec(&local_200.fPivot.super_TPZVec<int>,0);
  local_200.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_200.fPivot.super_TPZVec<int>.fStore = local_200.fPivot.fExtAlloc;
  local_200.fPivot.super_TPZVec<int>.fNElements = 0;
  local_200.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_200.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_200.fWork.fStore = (double *)0x0;
  local_200.fWork.fNElements = 0;
  local_200.fWork.fNAlloc = 0;
  local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018afc50;
  local_140.fElem = adStack_b0;
  local_140.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_140.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 5;
  local_140.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_140.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_140.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018b0900;
  local_140.fSize = 0xf;
  local_140.fGiven = local_140.fElem;
  TPZVec<int>::TPZVec(&local_140.fPivot.super_TPZVec<int>,0);
  local_140.fPivot.super_TPZVec<int>.fStore = local_140.fPivot.fExtAlloc;
  local_140.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_140.fPivot.super_TPZVec<int>.fNElements = 0;
  local_140.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_140.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_140.fWork.fStore = (double *)0x0;
  local_140.fWork.fNElements = 0;
  local_140.fWork.fNAlloc = 0;
  local_140.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018b0610;
  pztopology::TPZPyramid::TShape<double>(loc,&local_200,&local_140);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      x->fStore[uVar4] = 0.0;
      lVar3 = 0;
      do {
        if ((local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_200.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_200.fElem[lVar3];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar4,lVar3);
        x->fStore[uVar4] = dVar1 * extraout_XMM0_Qa + x->fStore[uVar4];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 5);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_140,&PTR_PTR_018b08c8);
  TPZFMatrix<double>::~TPZFMatrix(&local_200,&PTR_PTR_018aff08);
  return;
}

Assistant:

inline void TPZGeoPyramid::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<5,T> phi(5,1);
        TPZFNMatrix<15,T> dphi(3,5);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 5; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }